

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprNodeTest_NOT(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5ExprNode *p1;
  Fts5ExprNode *p2;
  int iVar1;
  int iVar2;
  
  p1 = pNode->apChild[0];
  p2 = *(Fts5ExprNode **)(pNode + 1);
  iVar2 = 0;
  while (iVar2 == 0) {
    iVar1 = p1->bEof;
    if (iVar1 != 0) {
      iVar2 = 0;
      goto LAB_001c6b06;
    }
    iVar1 = fts5NodeCompare(pExpr,p1,p2);
    if (iVar1 < 1) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*p2->xNext)(pExpr,p2,1,p1->iRowid);
      iVar1 = fts5NodeCompare(pExpr,p1,p2);
    }
    if ((iVar1 != 0) || (p2->bNomatch != 0)) break;
    iVar2 = (*p1->xNext)(pExpr,p1,0,0);
  }
  iVar1 = p1->bEof;
LAB_001c6b06:
  pNode->bEof = iVar1;
  pNode->bNomatch = p1->bNomatch;
  pNode->iRowid = p1->iRowid;
  if (iVar1 != 0) {
    fts5ExprNodeZeroPoslist(p2);
  }
  return iVar2;
}

Assistant:

static int fts5ExprNodeTest_NOT(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode             /* FTS5_NOT node to advance */
){
  int rc = SQLITE_OK;
  Fts5ExprNode *p1 = pNode->apChild[0];
  Fts5ExprNode *p2 = pNode->apChild[1];
  assert( pNode->nChild==2 );

  while( rc==SQLITE_OK && p1->bEof==0 ){
    int cmp = fts5NodeCompare(pExpr, p1, p2);
    if( cmp>0 ){
      rc = fts5ExprNodeNext(pExpr, p2, 1, p1->iRowid);
      cmp = fts5NodeCompare(pExpr, p1, p2);
    }
    assert( rc!=SQLITE_OK || cmp<=0 );
    if( cmp || p2->bNomatch ) break;
    rc = fts5ExprNodeNext(pExpr, p1, 0, 0);
  }
  pNode->bEof = p1->bEof;
  pNode->bNomatch = p1->bNomatch;
  pNode->iRowid = p1->iRowid;
  if( p1->bEof ){
    fts5ExprNodeZeroPoslist(p2);
  }
  return rc;
}